

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall Lexer::isPattern(Lexer *this,string *token,Type *type)

{
  size_t sVar1;
  bool bVar2;
  string word;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  if (this->_enablePattern == true) {
    sVar1 = this->_cursor;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_71);
    bVar2 = readWord(&this->_text,&local_70,&this->_cursor,&local_50);
    if (bVar2) {
      if (this->_eos <= this->_cursor) {
        std::__cxx11::string::~string((string *)&local_70);
LAB_00153ddb:
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        std::__cxx11::string::operator=((string *)token,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        *type = pattern;
        std::__cxx11::string::~string((string *)&local_50);
        return true;
      }
      bVar2 = unicodeWhitespace((int)(this->_text)._M_dataplus._M_p[this->_cursor]);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) goto LAB_00153ddb;
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
    }
    this->_cursor = sVar1;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return false;
}

Assistant:

bool Lexer::isPattern (std::string& token, Lexer::Type& type)
{
  if (_enablePattern)
  {
    std::size_t marker = _cursor;

    std::string word;
    if (readWord (_text, "/", _cursor, word) &&
        (isEOS () ||
         unicodeWhitespace (_text[_cursor])))
    {
      token = _text.substr (marker, _cursor - marker);
      type = Lexer::Type::pattern;
      return true;
    }

    _cursor = marker;
  }

  return false;
}